

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::decode_lines(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
               *this)

{
  pixel_type *ppVar1;
  pixel_type *ppVar2;
  process_line *ppVar3;
  anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 aVar4;
  uint32_t uVar5;
  triplet<unsigned_short> *__tmp;
  uint uVar6;
  int iVar7;
  size_type sVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  size_type __n;
  vector<int,_std::allocator<int>_> run_index;
  vector<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
  line_buffer;
  allocator_type local_81;
  uint32_t local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
  local_60;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar12 = (ulong)(this->width_ + 4);
  iVar7 = 1;
  if ((this->super_decoder_strategy).parameters_.interleave_mode == Line) {
    iVar7 = (this->super_decoder_strategy).frame_info_.component_count;
  }
  __n = (size_type)iVar7;
  lVar10 = __n * uVar12;
  std::vector<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>::
  vector(&local_60,lVar10 * 2,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__n,&local_81);
  uVar11 = 0;
  local_40 = lVar10 * 3;
  local_48 = -lVar10;
  local_7c = iVar7;
  while( true ) {
    uVar6 = (this->super_decoder_strategy).frame_info_.height - uVar11;
    if (this->restart_interval_ < uVar6) {
      uVar6 = this->restart_interval_;
    }
    uVar5 = uVar11;
    if (uVar6 != 0) {
      local_80 = uVar6 + uVar11;
      iVar9 = 0;
      local_38 = (ulong)uVar6;
      do {
        this->previous_line_ =
             local_60.
             super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        this->current_line_ =
             (pixel_type *)
             (&local_60.
               super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].field_0 + local_40);
        if ((uVar11 & 1) != 0) {
          this->previous_line_ =
               (pixel_type *)
               (&local_60.
                 super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].field_0 + local_40);
          this->current_line_ =
               local_60.
               super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        if (iVar7 != 0) {
          sVar8 = 0;
          do {
            this->run_index_ =
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar8];
            ppVar1 = this->previous_line_;
            uVar6 = this->width_;
            ppVar1[uVar6].field_2 = ppVar1[uVar6 - 1].field_2;
            aVar4 = ppVar1[uVar6 - 1].field_1;
            ppVar1[uVar6].field_0 = ppVar1[uVar6 - 1].field_0;
            ppVar1[uVar6].field_1 = aVar4;
            ppVar1 = this->previous_line_;
            ppVar2 = this->current_line_;
            ppVar2[-1].field_2 = ppVar1->field_2;
            aVar4 = ppVar1->field_1;
            ppVar2[-1].field_0 = ppVar1->field_0;
            ppVar2[-1].field_1 = aVar4;
            do_line(this,(triplet<unsigned_short> *)0x0);
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar8] = this->run_index_;
            this->previous_line_ = this->previous_line_ + uVar12;
            this->current_line_ = this->current_line_ + uVar12;
            sVar8 = sVar8 + 1;
          } while (__n != sVar8);
        }
        uVar6 = (this->rect_).Y;
        if ((uVar6 <= uVar11) && (uVar11 < uVar6 + (this->rect_).Height)) {
          ppVar3 = (this->super_decoder_strategy).process_line_._M_t.
                   super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
                   .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
          (*ppVar3->_vptr_process_line[2])
                    (ppVar3,this->current_line_ + (this->rect_).X + local_48,
                     (long)(this->rect_).Width,uVar12);
        }
        iVar9 = iVar9 + 1;
        uVar11 = uVar11 + 1;
        iVar7 = local_7c;
        uVar5 = local_80;
      } while (iVar9 != (int)local_38);
    }
    uVar11 = uVar5;
    if (uVar11 == (this->super_decoder_strategy).frame_info_.height) break;
    read_restart_marker(this);
    this->restart_interval_counter_ = this->restart_interval_counter_ + 1 & 7;
    decoder_strategy::reset(&this->super_decoder_strategy);
    if (local_60.
        super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_60.
        super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      memset(local_60.
             super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             ((ulong)((long)local_60.
                            super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                     (-6 - (long)local_60.
                                 super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) / 6) * 6 + 6);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,0,
             ((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish +
              (-4 - (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
    }
    reset_parameters(this);
  }
  decoder_strategy::end_scan(&this->super_decoder_strategy);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.
      super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void decode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{};;)
        {
            const uint32_t lines_in_interval{std::min(frame_info().height - line, restart_interval_)};

            for (uint32_t mcu{}; mcu < lines_in_interval; ++mcu, ++line)
            {
                previous_line_ = &line_buffer[1];
                current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
                if ((line & 1) == 1)
                {
                    std::swap(previous_line_, current_line_);
                }

                for (size_t component{}; component < component_count; ++component)
                {
                    run_index_ = run_index[component];

                    // initialize edge pixels used for prediction
                    previous_line_[width_] = previous_line_[width_ - 1];
                    current_line_[-1] = previous_line_[0];
                    do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                    run_index[component] = run_index_;
                    previous_line_ += pixel_stride;
                    current_line_ += pixel_stride;
                }

                // Only copy the line if it is part of the output rectangle.
                if (static_cast<uint32_t>(rect_.Y) <= line && line < static_cast<uint32_t>(rect_.Y + rect_.Height))
                {
                    Strategy::on_line_end(current_line_ + rect_.X - (static_cast<size_t>(component_count) * pixel_stride),
                                          rect_.Width,
                                          pixel_stride);
                }
            }

            if (line == frame_info().height)
                break;

            // At this point in the byte stream a restart marker should be present: process it.
            read_restart_marker();
            restart_interval_counter_ = (restart_interval_counter_ + 1) % jpeg_restart_marker_range;

            // After a restart marker it is required to reset the decoder.
            Strategy::reset();
            std::fill(line_buffer.begin(), line_buffer.end(), pixel_type{});
            std::fill(run_index.begin(), run_index.end(), 0);
            reset_parameters();
        }

        Strategy::end_scan();
    }